

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conveyer.cpp
# Opt level: O3

void Conveyer::printBinary(int numInTen)

{
  char *pcVar1;
  int i;
  uint uVar2;
  bool bVar3;
  
  uVar2 = 0xb;
  do {
    pcVar1 = "1";
    if (((uint)numInTen >> (uVar2 & 0x1f) & 1) == 0) {
      pcVar1 = "0";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,1);
    if ((uVar2 & 3) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-",1);
    }
    bVar3 = uVar2 != 0;
    uVar2 = uVar2 - 1;
  } while (bVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return;
}

Assistant:

void Conveyer::printBinary(int numInTen) {
    for (int i = MAX_RESULT_DIGIT_INDEX; i >= 0; i--) {
        if (numInTen & (1 << i)) {
            cout << "1";
        } else cout << "0";
        if (i % 4 == 0)cout << "-";
    }
    cout << endl;
}